

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O1

int make_rgb_colormap(png_image_read_control *display)

{
  int iVar1;
  png_uint_32 ip;
  png_uint_32 pVar2;
  png_uint_32 blue;
  uint g;
  int iVar3;
  
  iVar1 = 0;
  pVar2 = 0;
  do {
    iVar3 = 0;
    do {
      blue = 0;
      ip = pVar2;
      do {
        pVar2 = ip + 1;
        png_create_colormap_entry(display,ip,iVar1 * 0x33,iVar3 * 0x33,blue,0xff,1);
        blue = blue + 0x33;
        ip = pVar2;
      } while (blue != 0x132);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 6);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 6);
  return pVar2;
}

Assistant:

static int
make_rgb_colormap(png_image_read_control *display)
{
   unsigned int i, r;

   /* Build a 6x6x6 opaque RGB cube */
   for (i=r=0; r<6; ++r)
   {
      unsigned int g;

      for (g=0; g<6; ++g)
      {
         unsigned int b;

         for (b=0; b<6; ++b)
            png_create_colormap_entry(display, i++, r*51, g*51, b*51, 255,
                P_sRGB);
      }
   }

   return (int)i;
}